

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

string * show_encryption_method_abi_cxx11_
                   (string *__return_storage_ptr__,encryption_method_e method)

{
  string *extraout_RAX;
  string *psVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"unknown","");
  psVar1 = extraout_RAX;
  if (method < (e_aesv3|e_unknown)) {
    psVar1 = (string *)
             std::__cxx11::string::_M_replace
                       ((ulong)__return_storage_ptr__,0,
                        (char *)__return_storage_ptr__->_M_string_length,
                        (ulong)(&DAT_00264634 + *(int *)(&DAT_00264634 + (ulong)method * 4)));
  }
  return psVar1;
}

Assistant:

static std::string
show_encryption_method(QPDF::encryption_method_e method)
{
    std::string result = "unknown";
    switch (method) {
    case QPDF::e_none:
        result = "none";
        break;
    case QPDF::e_unknown:
        result = "unknown";
        break;
    case QPDF::e_rc4:
        result = "RC4";
        break;
    case QPDF::e_aes:
        result = "AESv2";
        break;
    case QPDF::e_aesv3:
        result = "AESv3";
        break;
        // no default so gcc will warn for missing case
    }
    return result;
}